

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::release_train(TrainManager *this,int argc,string *argv)

{
  undefined1 *this_00;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_01;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint y;
  uint uVar5;
  undefined4 extraout_var;
  pair<unsigned_int,_bool> pVar6;
  stationNameType *psVar7;
  undefined4 extraout_var_00;
  ostream *poVar8;
  invalid_command *this_02;
  long extraout_RDX;
  long lVar9;
  char *__src;
  long lVar10;
  pair<long,_bool> pVar11;
  allocator local_f9;
  pair<sjtu::TrainManager::stationNameType_*,_long> ret_;
  long local_c0;
  char local_b8;
  string trainID;
  string local_90;
  string local_70;
  string local_50;
  
  trainID._M_dataplus._M_p = (pointer)&trainID.field_2;
  trainID._M_string_length = 0;
  trainID.field_2._M_local_buf[0] = '\0';
  lVar9 = 0;
  while( true ) {
    if (argc <= lVar9) {
      this_01 = this->TrainBpTree;
      std::__cxx11::string::string((string *)&local_90,(string *)&trainID);
      this_00 = &this->field_0x10;
      ret_.first = (stationNameType *)StringHasher::operator()((StringHasher *)this_00,&local_90);
      pVar11 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                         (this_01,(unsigned_long_long *)&ret_);
      local_c0 = pVar11.first;
      local_b8 = pVar11.second;
      std::__cxx11::string::~string((string *)&local_90);
      if (local_b8 == '\0') {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      else {
        iVar4 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base
                  [2])(this->TrainFile,&local_c0);
        lVar9 = CONCAT44(extraout_var,iVar4);
        if (*(char *)(lVar9 + 0xa799) == '\0') {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(lVar9 + 0xa7a0);
          y = SUB164(auVar2 / ZEXT816(0xa7a8),0) - 1;
          __src = (char *)(lVar9 + 0x20);
          for (lVar10 = 0; lVar10 < *(int *)(lVar9 + 0x18); lVar10 = lVar10 + 1) {
            pBVar1 = this->StationBpTree;
            std::__cxx11::string::string((string *)&local_50,__src,&local_f9);
            ret_.first = (stationNameType *)
                         StringHasher::operator()((StringHasher *)this_00,&local_50);
            pVar6 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                    ::find(pBVar1,(unsigned_long_long *)&ret_);
            std::__cxx11::string::~string((string *)&local_50);
            if (((ulong)pVar6 >> 0x20 & 1) == 0) {
              pBVar1 = this->StationBpTree;
              std::__cxx11::string::string((string *)&local_70,__src,&local_f9);
              psVar7 = (stationNameType *)
                       StringHasher::operator()((StringHasher *)this_00,&local_70);
              uVar5 = bitset_newblock(this,y);
              ret_.second = CONCAT44(ret_.second._4_4_,uVar5);
              ret_.first = psVar7;
              BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
              insert(pBVar1,(value_type *)&ret_);
              std::__cxx11::string::~string((string *)&local_70);
              iVar4 = (*(this->StationFile->
                        super_FileManager_Base<sjtu::TrainManager::stationNameType>).
                        _vptr_FileManager_Base[1])();
              ret_.first = (stationNameType *)CONCAT44(extraout_var_00,iVar4);
              ret_.second = extraout_RDX;
              strcpy((char *)ret_.first,__src);
              (*(this->StationFile->super_FileManager_Base<sjtu::TrainManager::stationNameType>).
                _vptr_FileManager_Base[3])(this->StationFile,&ret_.second);
            }
            else {
              bitset_set(this,pVar6.first,y,1);
            }
            __src = __src + 0x1a8;
          }
          *(undefined1 *)(lVar9 + 0xa799) = 1;
          iVar4 = 0;
          (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
                    (this->TrainFile,lVar9 + 0xa7a0);
        }
        else {
          iVar4 = -1;
        }
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::__cxx11::string::~string((string *)&trainID);
      return;
    }
    bVar3 = std::operator==(argv,"-i");
    if (!bVar3) break;
    std::__cxx11::string::_M_assign((string *)&trainID);
    lVar9 = lVar9 + 2;
    argv = argv + 2;
  }
  this_02 = (invalid_command *)__cxa_allocate_exception(0x68);
  invalid_command::invalid_command(this_02);
  __cxa_throw(this_02,&invalid_command::typeinfo,invalid_command::~invalid_command);
}

Assistant:

void release_train(int argc , std::string *argv)
		{
			std::string trainID;
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-i") trainID = argv[i + 1];
				else throw invalid_command();
			auto ret = TrainBpTree -> find(hasher(trainID));
			if (ret.second == false) std::cout << -1 << std::endl;
			else
			{
				trainType *train = TrainFile -> read(ret.first);
				if (train -> is_released == true) std::cout << -1 << std::endl;
				else
				{
					for (int i = 0 , train_id = train -> offset / sizeof (DynamicFileManager<trainType>::valueType) - 1;i < train -> stationNum;++ i)
					{
						auto ret = StationBpTree -> find(hasher(train -> stations[i].stationName));
						if (ret.second) bitset_set(ret.first , train_id);
						else
						{
							StationBpTree -> insert(std::make_pair(hasher(train -> stations[i].stationName) , bitset_newblock(train_id)));
							auto ret_ = StationFile -> newspace();
							strcpy(ret_.first -> name , train -> stations[i].stationName);
							StationFile -> save(ret_.second);
						}
					}
					train -> is_released = true , TrainFile -> save(train -> offset);
					std::cout << 0 << std::endl;
				}
			}
		}